

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.hpp
# Opt level: O3

void __thiscall lightconf::scanner::expect(scanner *this,char c,bool optional)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  pointer pcVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  ulong uVar10;
  long *plVar11;
  undefined8 *puVar12;
  runtime_error *this_00;
  uint uVar13;
  long *plVar14;
  ulong *puVar15;
  token *extraout_RDX;
  token *tok_00;
  undefined8 uVar16;
  ulong uVar17;
  undefined8 uVar18;
  pointer ptVar19;
  bool bVar20;
  bool bVar21;
  token tok;
  token tok_2;
  token tok_1;
  ulong *local_190;
  token *local_188;
  ulong local_180;
  undefined4 uStack_178;
  undefined4 uStack_174;
  undefined8 *local_170;
  undefined8 local_168;
  undefined8 local_160;
  undefined4 uStack_158;
  undefined4 uStack_154;
  string local_150;
  long *local_130;
  long local_128;
  long local_120;
  long lStack_118;
  token_type local_110 [2];
  undefined1 *local_108;
  undefined8 local_100;
  undefined1 local_f8 [16];
  double local_e8;
  uint uStack_e0;
  undefined4 uStack_dc;
  undefined4 uStack_d8;
  undefined4 uStack_d4;
  token_type local_d0;
  undefined1 *local_c8;
  undefined8 local_c0;
  undefined1 local_b8 [16];
  double local_a8;
  uint uStack_a0;
  int iStack_9c;
  undefined4 uStack_98;
  undefined4 local_94;
  token_type local_90;
  undefined1 *local_88;
  undefined8 local_80;
  undefined1 local_78 [16];
  double local_68;
  uint uStack_60;
  int iStack_5c;
  undefined4 uStack_58;
  undefined4 local_54;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  uVar13 = this->cur_token_;
  ptVar19 = (this->tokens_).super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>.
            _M_impl.super__Vector_impl_data._M_start;
  uVar10 = (long)(this->tokens_).
                 super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)ptVar19 >> 6;
  do {
    uVar17 = (ulong)uVar13;
    if (uVar10 <= uVar17) break;
    uVar13 = uVar13 + 1;
  } while (ptVar19[uVar17].type - whitespace_token < 2);
  if (uVar10 != uVar17) {
    local_110[0] = ptVar19[uVar17].type;
    pcVar5 = ptVar19[uVar17].string_value._M_dataplus._M_p;
    local_108 = local_f8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_108,pcVar5,pcVar5 + ptVar19[uVar17].string_value._M_string_length);
    local_e8 = ptVar19[uVar17].number_value;
    uVar18 = (&ptVar19[uVar17].number_value)[1];
    uStack_e0 = (uint)uVar18;
    uVar13 = uStack_e0;
    uStack_dc = (undefined4)((ulong)uVar18 >> 0x20);
    uVar2 = ptVar19[uVar17].line;
    uVar6 = ptVar19[uVar17].col;
    bVar20 = local_110[0] == char_token;
    uStack_e0._0_1_ = (char)uVar18;
    bVar21 = (char)uStack_e0 == c;
    uStack_e0 = uVar13;
    uStack_d8 = uVar2;
    uStack_d4 = uVar6;
    if (local_108 != local_f8) {
      operator_delete(local_108);
    }
    if (bVar21 && bVar20) {
      skip_whitespace(this,false);
      if (((long)(this->tokens_).
                 super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(this->tokens_).
                 super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
                 super__Vector_impl_data._M_start >> 6) - 1U < (ulong)this->cur_token_) {
        return;
      }
      this->cur_token_ = this->cur_token_ + 1;
      return;
    }
  }
  if (optional) {
    return;
  }
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct((ulong)local_50,'\x01');
  plVar11 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x11a878);
  local_130 = (long *)*plVar11;
  plVar14 = plVar11 + 2;
  if (local_130 == plVar14) {
    local_120 = *plVar14;
    lStack_118 = plVar11[3];
    local_130 = &local_120;
  }
  else {
    local_120 = *plVar14;
  }
  local_128 = plVar11[1];
  *plVar11 = (long)plVar14;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  plVar11 = (long *)std::__cxx11::string::append((char *)&local_130);
  local_190 = (ulong *)*plVar11;
  puVar15 = (ulong *)(plVar11 + 2);
  if (local_190 == puVar15) {
    local_180 = *puVar15;
    uStack_178 = (undefined4)plVar11[3];
    uStack_174 = *(undefined4 *)((long)plVar11 + 0x1c);
    local_190 = &local_180;
  }
  else {
    local_180 = *puVar15;
  }
  tok_00 = (token *)plVar11[1];
  *plVar11 = (long)puVar15;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  uVar10 = (ulong)this->cur_token_;
  ptVar19 = (this->tokens_).super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>.
            _M_impl.super__Vector_impl_data._M_start;
  local_188 = tok_00;
  if ((long)(this->tokens_).super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>.
            _M_impl.super__Vector_impl_data._M_finish - (long)ptVar19 >> 6 == uVar10) {
    local_108 = local_f8;
    local_100 = 0;
    local_f8[0] = 0;
    local_e8 = 0.0;
    uStack_e0 = uStack_e0 & 0xffffff00;
    uStack_dc = 0;
    uStack_d8 = 0;
    uStack_d4 = 0;
    local_110[0] = eof_token;
  }
  else {
    local_110[0] = ptVar19[uVar10].type;
    local_108 = local_f8;
    pcVar5 = ptVar19[uVar10].string_value._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_108,pcVar5,pcVar5 + ptVar19[uVar10].string_value._M_string_length);
    uVar3 = ptVar19[uVar10].line;
    uVar7 = ptVar19[uVar10].col;
    local_e8 = ptVar19[uVar10].number_value;
    ptVar19 = ptVar19 + uVar10;
    uVar18._0_1_ = ptVar19->char_value;
    uVar18._1_3_ = *(undefined3 *)&ptVar19->field_0x31;
    uVar18._4_4_ = ptVar19->pos;
    uStack_e0 = (uint)uVar18;
    tok_00 = extraout_RDX;
    uStack_dc = uVar18._4_4_;
    uStack_d8 = uVar3;
    uStack_d4 = uVar7;
  }
  token_name_abi_cxx11_(&local_150,(lightconf *)local_110,tok_00);
  uVar10 = (long)&local_188->type + local_150._M_string_length;
  uVar17 = 0xf;
  if (local_190 != &local_180) {
    uVar17 = local_180;
  }
  if (uVar17 < uVar10) {
    uVar18 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      uVar18 = local_150.field_2._M_allocated_capacity;
    }
    if (uVar10 <= (ulong)uVar18) {
      puVar12 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_150,0,(char *)0x0,(ulong)local_190);
      goto LAB_0010db11;
    }
  }
  puVar12 = (undefined8 *)
            std::__cxx11::string::_M_append((char *)&local_190,(ulong)local_150._M_dataplus._M_p);
LAB_0010db11:
  local_170 = (undefined8 *)*puVar12;
  puVar1 = puVar12 + 2;
  if (local_170 == puVar1) {
    local_160 = *puVar1;
    uStack_158 = *(undefined4 *)(puVar12 + 3);
    uStack_154 = *(undefined4 *)((long)puVar12 + 0x1c);
    local_170 = &local_160;
  }
  else {
    local_160 = *puVar1;
  }
  local_168 = puVar12[1];
  *puVar12 = puVar1;
  puVar12[1] = 0;
  *(undefined1 *)puVar1 = 0;
  uVar17 = (ulong)this->cur_token_;
  ptVar19 = (this->tokens_).super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>.
            _M_impl.super__Vector_impl_data._M_start;
  uVar10 = (long)(this->tokens_).
                 super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)ptVar19 >> 6;
  if (uVar10 == uVar17) {
    local_88 = local_78;
    uVar16 = 0;
    local_80 = 0;
    local_78[0] = 0;
    local_68 = 0.0;
    uStack_60 = uStack_60 & 0xffffff00;
    iStack_5c = 0;
    uStack_58 = 0;
    local_54 = 0;
    local_90 = eof_token;
  }
  else {
    local_90 = ptVar19[uVar17].type;
    local_88 = local_78;
    pcVar5 = ptVar19[uVar17].string_value._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_88,pcVar5,pcVar5 + ptVar19[uVar17].string_value._M_string_length);
    uVar16._0_4_ = ptVar19[uVar17].line;
    uVar16._4_4_ = ptVar19[uVar17].col;
    local_68 = ptVar19[uVar17].number_value;
    uStack_60 = *(uint *)&ptVar19[uVar17].char_value;
    iStack_5c = ptVar19[uVar17].pos;
    uVar17 = (ulong)this->cur_token_;
    ptVar19 = (this->tokens_).
              super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar10 = (long)(this->tokens_).
                   super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)ptVar19 >> 6;
    uStack_58 = (undefined4)uVar16;
    local_54 = uVar16._4_4_;
  }
  if (uVar10 == uVar17) {
    local_c8 = local_b8;
    local_c0 = 0;
    local_b8[0] = 0;
    local_a8 = 0.0;
    uStack_a0 = uStack_a0 & 0xffffff00;
    iStack_9c = 0;
    uStack_98 = 0;
    local_94 = 0;
    local_d0 = eof_token;
  }
  else {
    local_d0 = ptVar19[uVar17].type;
    local_c8 = local_b8;
    pcVar5 = ptVar19[uVar17].string_value._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c8,pcVar5,pcVar5 + ptVar19[uVar17].string_value._M_string_length);
    uVar4 = ptVar19[uVar17].line;
    uVar8 = ptVar19[uVar17].col;
    local_a8 = ptVar19[uVar17].number_value;
    uStack_a0 = *(uint *)&ptVar19[uVar17].char_value;
    iStack_9c = ptVar19[uVar17].pos;
    uStack_98 = uVar4;
    local_94 = uVar8;
  }
  uVar9 = local_94;
  this_00 = (runtime_error *)__cxa_allocate_exception(0x18);
  std::runtime_error::runtime_error(this_00,(string *)&local_170);
  *(undefined ***)this_00 = &PTR__runtime_error_00120cb8;
  *(int *)(this_00 + 0x10) = (int)uVar16;
  *(undefined4 *)(this_00 + 0x14) = uVar9;
  __cxa_throw(this_00,&parse_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline void scanner::expect(char c, bool optional) {
    if (peek_token().is_char(c)) {
        skip_whitespace(false);
        next_token();
    } else {
        if (!optional) {
            fail("expected '" + std::string(1, c) + "' but found " + token_name(cur_token()),
                cur_token().line, cur_token().col);
        }
    }
}